

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

value loader_metadata_impl(plugin p,loader_impl impl)

{
  char *__string;
  loader_impl impl_00;
  size_t sVar1;
  plugin ppVar2;
  value pvVar3;
  undefined8 in_RDI;
  value v;
  value *v_ptr;
  char *tag;
  value local_8;
  
  __string = (char *)plugin_name(in_RDI);
  local_8 = (value)value_create_array(0,2);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    impl_00 = (loader_impl)value_to_array(local_8);
    sVar1 = strnlen(__string,0x40);
    ppVar2 = (plugin)value_create_string(__string,sVar1);
    impl_00->p = ppVar2;
    if (impl_00->p == (plugin)0x0) {
      value_type_destroy(local_8);
      local_8 = (value)0x0;
    }
    else {
      pvVar3 = loader_impl_metadata(impl_00);
      *(value *)&impl_00->init = pvVar3;
      if (*(long *)&impl_00->init == 0) {
        value_type_destroy(local_8);
        local_8 = (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value loader_metadata_impl(plugin p, loader_impl impl)
{
	const char *tag = plugin_name(p);

	value *v_ptr, v = value_create_array(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_ptr = value_to_array(v);

	v_ptr[0] = value_create_string(tag, strnlen(tag, LOADER_TAG_SIZE));

	if (v_ptr[0] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	v_ptr[1] = loader_impl_metadata(impl);

	if (v_ptr[1] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	return v;
}